

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall duckdb::ColumnData::InitializeAppend(ColumnData *this,ColumnAppendState *state)

{
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *this_00;
  reference pvVar1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> this_01;
  SegmentLock l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this_00 = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes;
  if ((this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
               super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               .
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    pvVar1 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[](this_00,0);
    if ((pvVar1->node).
        super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
        super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
        .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl != (ColumnSegment *)0x0)
    goto LAB_010db445;
  }
  AppendTransientSegment(this,(SegmentLock *)&local_28,this->start);
LAB_010db445:
  if ((this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
               super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               .
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    this_01._M_head_impl = (ColumnSegment *)0x0;
  }
  else {
    pvVar1 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(this_00);
    this_01._M_head_impl =
         (pvVar1->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  }
  if (((this_01._M_head_impl)->segment_type == PERSISTENT) ||
     ((((this_01._M_head_impl)->function)._M_data)->init_append == (compression_init_append_t)0x0))
  {
    AppendTransientSegment
              (this,(SegmentLock *)&local_28,
               ((this_01._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment>).count.
               super___atomic_base<unsigned_long>._M_i +
               ((this_01._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment>).start);
    pvVar1 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(this_00);
    this_01._M_head_impl =
         (pvVar1->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  }
  state->current = this_01._M_head_impl;
  ColumnSegment::InitializeAppend(this_01._M_head_impl,state);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void ColumnData::InitializeAppend(ColumnAppendState &state) {
	auto l = data.Lock();
	if (data.IsEmpty(l)) {
		// no segments yet, append an empty segment
		AppendTransientSegment(l, start);
	}
	auto segment = data.GetLastSegment(l);
	if (segment->segment_type == ColumnSegmentType::PERSISTENT || !segment->GetCompressionFunction().init_append) {
		// we cannot append to this segment - append a new segment
		auto total_rows = segment->start + segment->count;
		AppendTransientSegment(l, total_rows);
		state.current = data.GetLastSegment(l);
	} else {
		state.current = segment;
	}

	D_ASSERT(state.current->segment_type == ColumnSegmentType::TRANSIENT);
	state.current->InitializeAppend(state);
	D_ASSERT(state.current->GetCompressionFunction().append);
}